

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::decodeString(OurReader *this,Token *token)

{
  Location pCVar1;
  anon_struct_4_2_14fb5ae2_for_bits_ aVar2;
  ValueHolder *pVVar3;
  ValueHolder VVar4;
  Value *pVVar5;
  Location pCVar6;
  bool bVar7;
  _Elt_pointer ppVVar8;
  undefined1 auVar9 [16];
  String decoded_string;
  Value decoded;
  String local_68;
  ValueHolder local_48;
  anon_struct_4_2_14fb5ae2_for_bits_ local_40;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  bVar7 = decodeString(this,token,&local_68);
  if (bVar7) {
    Value::Value((Value *)&local_48,&local_68);
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar3 = &ppVVar8[-1]->value_;
    aVar2 = *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar3 + 1);
    *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar3 + 1) = local_40;
    VVar4 = *pVVar3;
    *pVVar3 = local_48;
    ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar8 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar8 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar8 = ppVVar8 + -1;
    }
    pVVar5 = *ppVVar8;
    pCVar6 = token->end_;
    pCVar1 = this->begin_;
    auVar9._8_4_ = (int)pCVar1;
    auVar9._0_8_ = pCVar1;
    auVar9._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    pVVar5->start_ = (long)token->start_ - (long)pCVar1;
    pVVar5->limit_ = (long)pCVar6 - auVar9._8_8_;
    local_48 = VVar4;
    local_40 = aVar2;
    Value::~Value((Value *)&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool OurReader::decodeString(Token& token) {
  String decoded_string;
  if (!decodeString(token, decoded_string))
    return false;
  Value decoded(decoded_string);
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}